

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# collationfastlatin.cpp
# Opt level: O1

uint32_t icu_63::CollationFastLatin::nextPair
                   (uint16_t *table,UChar32 c,uint32_t ce,UChar *s16,uint8_t *s8,int32_t *sIndex,
                   int32_t *sLength)

{
  byte bVar1;
  UChar UVar2;
  int iVar3;
  int iVar4;
  bool bVar5;
  ulong uVar6;
  uint uVar7;
  uint uVar8;
  long lVar9;
  uint uVar10;
  ulong uVar11;
  uint uVar12;
  
  if (ce - 0xc00 < 0xfffff800) {
    return ce;
  }
  if (0x7ff < ce) {
    return *(uint32_t *)(table + (ulong)(ce & 0x3ff) + 0x1c0);
  }
  iVar3 = *sLength;
  if (iVar3 < 0 && c == 0) {
    *sLength = *sIndex + -1;
    return 2;
  }
  uVar8 = (ce & 0x3ff) + 0x1c0;
  iVar4 = *sIndex;
  if (iVar4 == iVar3) goto LAB_00236c6c;
  lVar9 = (long)iVar4;
  uVar6 = lVar9 + 1;
  if (s16 == (UChar *)0x0) {
    bVar1 = s8[lVar9];
    uVar7 = (uint)bVar1;
    if (-1 < (char)bVar1) goto LAB_00236b98;
    if (((int)uVar6 == iVar3 || (byte)(bVar1 + 0x3a) < 0xfc) || (-0x41 < (char)s8[uVar6])) {
      if ((iVar3 < 0 || (int)(lVar9 + 2) < iVar3) &&
         (((uVar7 == 0xef && (s8[uVar6] == 0xbf)) && ((s8[lVar9 + 2] & 0xfe) == 0xbe)))) {
        uVar7 = 0xffffffff;
        uVar6 = (ulong)(iVar4 + 3);
        bVar5 = true;
      }
      else {
        bVar5 = false;
      }
    }
    else {
      uVar7 = (uVar7 * 0x40 + (uint)s8[uVar6]) - 0x3080;
      uVar6 = (ulong)(iVar4 + 2);
      bVar5 = true;
    }
    if (bVar5) goto LAB_00236b98;
LAB_00236c61:
    bVar5 = false;
  }
  else {
    UVar2 = s16[lVar9];
    uVar7 = (uint)(ushort)UVar2;
    if (0x17f < (ushort)UVar2) {
      if ((UVar2 & 0xffc0U) == 0x2000) {
        uVar7 = (ushort)UVar2 - 0x1e80;
      }
      else {
        uVar7 = 0xffffffff;
        if ((ushort)UVar2 < 0xfffe) goto LAB_00236c61;
      }
    }
LAB_00236b98:
    if (uVar7 == 0 && iVar3 < 0) {
      *sLength = iVar4;
      uVar7 = 0xffffffff;
    }
    uVar12 = (uint)table[uVar8];
    uVar11 = (ulong)uVar8;
    do {
      uVar10 = (int)uVar11 + (uVar12 >> 9);
      uVar11 = (ulong)uVar10;
      uVar12 = (uint)table[uVar11];
    } while ((int)(uVar12 & 0x1ff) < (int)uVar7);
    bVar5 = true;
    if ((uVar12 & 0x1ff) == uVar7) {
      *sIndex = (int32_t)uVar6;
      uVar8 = uVar10;
    }
  }
  if (!bVar5) {
    return 1;
  }
LAB_00236c6c:
  lVar9 = (long)(int)uVar8;
  uVar8 = 1;
  if (table[lVar9] >> 9 != 1) {
    uVar8 = (uint)table[lVar9 + 1];
    if (table[lVar9] >> 9 != 2) {
      uVar8 = CONCAT22(table[lVar9 + 2],table[lVar9 + 1]);
    }
  }
  return uVar8;
}

Assistant:

uint32_t
CollationFastLatin::nextPair(const uint16_t *table, UChar32 c, uint32_t ce,
                             const UChar *s16, const uint8_t *s8, int32_t &sIndex, int32_t &sLength) {
    if(ce >= MIN_LONG || ce < CONTRACTION) {
        return ce;  // simple or special mini CE
    } else if(ce >= EXPANSION) {
        int32_t index = NUM_FAST_CHARS + (ce & INDEX_MASK);
        return ((uint32_t)table[index + 1] << 16) | table[index];
    } else /* ce >= CONTRACTION */ {
        if(c == 0 && sLength < 0) {
            sLength = sIndex - 1;
            return EOS;
        }
        // Contraction list: Default mapping followed by
        // 0 or more single-character contraction suffix mappings.
        int32_t index = NUM_FAST_CHARS + (ce & INDEX_MASK);
        if(sIndex != sLength) {
            // Read the next character.
            int32_t c2;
            int32_t nextIndex = sIndex;
            if(s16 != NULL) {
                c2 = s16[nextIndex++];
                if(c2 > LATIN_MAX) {
                    if(PUNCT_START <= c2 && c2 < PUNCT_LIMIT) {
                        c2 = c2 - PUNCT_START + LATIN_LIMIT;  // 2000..203F -> 0180..01BF
                    } else if(c2 == 0xfffe || c2 == 0xffff) {
                        c2 = -1;  // U+FFFE & U+FFFF cannot occur in contractions.
                    } else {
                        return BAIL_OUT;
                    }
                }
            } else {
                c2 = s8[nextIndex++];
                if(c2 > 0x7f) {
                    uint8_t t;
                    if(c2 <= 0xc5 && 0xc2 <= c2 && nextIndex != sLength &&
                            0x80 <= (t = s8[nextIndex]) && t <= 0xbf) {
                        c2 = ((c2 - 0xc2) << 6) + t;  // 0080..017F
                        ++nextIndex;
                    } else {
                        int32_t i2 = nextIndex + 1;
                        if(i2 < sLength || sLength < 0) {
                            if(c2 == 0xe2 && s8[nextIndex] == 0x80 &&
                                    0x80 <= (t = s8[i2]) && t <= 0xbf) {
                                c2 = (LATIN_LIMIT - 0x80) + t;  // 2000..203F -> 0180..01BF
                            } else if(c2 == 0xef && s8[nextIndex] == 0xbf &&
                                    ((t = s8[i2]) == 0xbe || t == 0xbf)) {
                                c2 = -1;  // U+FFFE & U+FFFF cannot occur in contractions.
                            } else {
                                return BAIL_OUT;
                            }
                        } else {
                            return BAIL_OUT;
                        }
                        nextIndex += 2;
                    }
                }
            }
            if(c2 == 0 && sLength < 0) {
                sLength = sIndex;
                c2 = -1;
            }
            // Look for the next character in the contraction suffix list,
            // which is in ascending order of single suffix characters.
            int32_t i = index;
            int32_t head = table[i];  // first skip the default mapping
            int32_t x;
            do {
                i += head >> CONTR_LENGTH_SHIFT;
                head = table[i];
                x = head & CONTR_CHAR_MASK;
            } while(x < c2);
            if(x == c2) {
                index = i;
                sIndex = nextIndex;
            }
        }
        // Return the CE or CEs for the default or contraction mapping.
        int32_t length = table[index] >> CONTR_LENGTH_SHIFT;
        if(length == 1) {
            return BAIL_OUT;
        }
        ce = table[index + 1];
        if(length == 2) {
            return ce;
        } else {
            return ((uint32_t)table[index + 2] << 16) | ce;
        }
    }
}